

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
* __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::writeImpl
          (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
           *__return_storage_ptr__,BlockedRead *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData)

{
  size_t *psVar1;
  ulong uVar2;
  size_t sVar3;
  ulong __n;
  uchar *__src;
  size_t n;
  ArrayPtr<const_unsigned_char> *pAVar4;
  size_t sVar5;
  bool bVar6;
  ulong local_40;
  size_t local_38;
  
  pAVar4 = moreData.ptr;
  __n = data.size_;
  __src = data.ptr;
  sVar5 = moreData.size_;
  do {
    uVar2 = (this->readBuffer).size_;
    if (uVar2 <= __n) {
      local_40 = (this->readSoFar).byteCount + uVar2;
      (this->readSoFar).byteCount = local_40;
      local_38 = (this->readSoFar).capCount;
      (*(this->fulfiller->super_PromiseRejector)._vptr_PromiseRejector[2])();
      if ((BlockedRead *)(this->pipe->state).ptr == this) {
        (this->pipe->state).ptr = (AsyncCapabilityStream *)0x0;
      }
      memcpy((this->readBuffer).ptr,__src,uVar2);
      if (__n == uVar2 && sVar5 == 0) {
        __return_storage_ptr__->tag = 1;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->tag = 2;
      *(uchar **)&__return_storage_ptr__->field_1 = __src + uVar2;
      *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) = __n - uVar2;
      *(ArrayPtr<const_unsigned_char> **)((long)&__return_storage_ptr__->field_1 + 0x10) = pAVar4;
      *(size_t *)((long)&__return_storage_ptr__->field_1 + 0x18) = sVar5;
      return __return_storage_ptr__;
    }
    memcpy((this->readBuffer).ptr,__src,__n);
    uVar2 = (this->readSoFar).byteCount + __n;
    (this->readSoFar).byteCount = uVar2;
    (this->readBuffer).ptr = (this->readBuffer).ptr + __n;
    psVar1 = &(this->readBuffer).size_;
    *psVar1 = *psVar1 - __n;
    if (sVar5 == 0) {
      if (this->minBytes <= uVar2) {
        local_38 = (this->readSoFar).capCount;
        local_40 = uVar2;
        (*(this->fulfiller->super_PromiseRejector)._vptr_PromiseRejector[2])
                  (this->fulfiller,&local_40);
        if ((BlockedRead *)(this->pipe->state).ptr == this) {
          (this->pipe->state).ptr = (AsyncCapabilityStream *)0x0;
        }
      }
      __return_storage_ptr__->tag = 1;
      sVar3 = sVar5;
    }
    else {
      __src = pAVar4->ptr;
      __n = pAVar4->size_;
      pAVar4 = pAVar4 + 1;
      sVar3 = sVar5 - 1;
    }
    bVar6 = sVar5 != 0;
    sVar5 = sVar3;
  } while (bVar6);
  return __return_storage_ptr__;
}

Assistant:

OneOf<Done, Retry> writeImpl(ArrayPtr<const byte> data,
                                 ArrayPtr<const ArrayPtr<const byte>> moreData) {
      for (;;) {
        if (data.size() < readBuffer.size()) {
          // First write segment consumes a portion of the read buffer but not all of it.
          auto n = data.size();
          memcpy(readBuffer.begin(), data.begin(), n);
          readSoFar.byteCount += n;
          readBuffer = readBuffer.slice(n, readBuffer.size());
          if (moreData.size() == 0) {
            // Consumed all written pieces.
            if (readSoFar.byteCount >= minBytes) {
              // We've read enough to close out this read.
              fulfiller.fulfill(kj::cp(readSoFar));
              pipe.endState(*this);
            }
            return Done();
          }
          data = moreData[0];
          moreData = moreData.slice(1, moreData.size());
          // loop
        } else {
          // First write segment consumes entire read buffer.
          auto n = readBuffer.size();
          readSoFar.byteCount += n;
          fulfiller.fulfill(kj::cp(readSoFar));
          pipe.endState(*this);
          memcpy(readBuffer.begin(), data.begin(), n);

          data = data.slice(n, data.size());
          if (data.size() == 0 && moreData.size() == 0) {
            return Done();
          } else {
            // Note: Even if `data` is empty, we don't replace it with moreData[0], because the
            //   retry might need to use write(ArrayPtr<ArrayPtr<byte>>) which doesn't allow
            //   passing a separate first segment.
            return Retry { data, moreData };
          }
        }
      }
    }